

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

void predict_iforest<float,unsigned_long>
               (float *numeric_data,int *categ_data,bool is_col_major,size_t ld_numeric,
               size_t ld_categ,float *Xc,unsigned_long *Xc_ind,unsigned_long *Xc_indptr,float *Xr,
               unsigned_long *Xr_ind,unsigned_long *Xr_indptr,size_t nrows,int nthreads,
               bool standardize,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               double *output_depths,unsigned_long *tree_num,double *per_tree_depths,
               TreesIndexer *indexer)

{
  pointer pSVar1;
  pointer puVar2;
  void *__tmp;
  ulong uVar3;
  double *pdVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  ExtIsoForest *pEVar7;
  pointer pvVar8;
  pointer pvVar9;
  pointer pvVar10;
  pointer pvVar11;
  undefined8 uVar12;
  ScoringMetric SVar13;
  long lVar14;
  undefined7 in_register_00000011;
  PredictionData<float,_unsigned_long> *prediction_data_00;
  PredictionData<float,_unsigned_long> *extraout_RDX;
  PredictionData<float,_unsigned_long> *extraout_RDX_00;
  PredictionData<float,_unsigned_long> *extraout_RDX_01;
  size_t row;
  unsigned_long *puVar15;
  double *pdVar16;
  uint uVar17;
  undefined7 uVar18;
  pointer pvVar19;
  pointer pvVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  PredictionData<float,_unsigned_long> *pPVar29;
  PredictionData<float,_unsigned_long> prediction_data;
  double local_f0;
  PredictionData<float,_unsigned_long> *local_e8;
  undefined8 local_e0;
  double local_d8;
  double dStack_d0;
  long local_c0;
  long local_b8 [2];
  ulong local_a8;
  int local_9c;
  int *local_98;
  PredictionData<float,_unsigned_long> local_90;
  
  prediction_data_00 =
       (PredictionData<float,_unsigned_long> *)CONCAT71(in_register_00000011,is_col_major);
  if (nrows == 0) {
    return;
  }
  local_90.nrows = nrows;
  local_90.Xc_ind = Xc_ind;
  local_90.Xc_indptr = Xc_indptr;
  local_90.Xr = Xr;
  local_90.Xr_ind = Xr_ind;
  local_9c = (int)nrows;
  if ((ulong)(long)nthreads <= nrows) {
    local_9c = nthreads;
  }
  local_90.Xr_indptr = Xr_indptr;
  local_98 = categ_data;
  local_90.numeric_data = numeric_data;
  local_90.categ_data = categ_data;
  local_90.is_col_major = is_col_major;
  local_90.ncols_numeric = ld_numeric;
  local_90.ncols_categ = ld_categ;
  local_90.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (unsigned_long *)0x0) {
    batched_csc_predict<float,unsigned_long>
              (&local_90,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
    prediction_data_00 = extraout_RDX;
LAB_00147f71:
    if (model_outputs != (IsoForest *)0x0) {
      pvVar20 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar11 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00147f7d;
    }
    lVar14 = ((long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    auVar28._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar28._0_8_ = lVar14;
    auVar28._12_4_ = 0x45300000;
    dStack_d0 = auVar28._8_8_ - 1.9342813113834067e+25;
    local_d8 = dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
    pPVar29 = (PredictionData<float,_unsigned_long> *)(model_outputs_ext->exp_avg_depth * local_d8);
    SVar13 = model_outputs_ext->scoring_metric;
    bVar23 = SVar13 == Density;
    bVar24 = SVar13 == BoxedRatio;
    uVar17 = (uint)(SVar13 == BoxedDensity);
    local_e0 = CONCAT44(local_e0._4_4_,(int)CONCAT71((int7)((ulong)prediction_data_00 >> 8),1));
LAB_0014808f:
    bVar25 = SVar13 == BoxedDensity2;
  }
  else {
    if (model_outputs == (IsoForest *)0x0) {
      if ((((Xc_indptr == (unsigned_long *)0x0) && (model_outputs_ext->missing_action == Fail)) &&
          (Xr_indptr == (unsigned_long *)0x0)) &&
         ((categ_data == (int *)0x0 && (model_outputs_ext->has_range_penalty == false)))) {
        pvVar10 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar8 = (model_outputs_ext->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (nrows == 1 || !is_col_major) {
          prediction_data_00 = (PredictionData<float,_unsigned_long> *)(nrows * 8);
          lVar14 = 0;
          local_d8 = 0.0;
          local_e8 = prediction_data_00;
          do {
            local_f0 = 0.0;
            pvVar19 = pvVar10;
            if ((long)pvVar8 - (long)pvVar10 != 0) {
              uVar3 = ((long)pvVar8 - (long)pvVar10 >> 3) * -0x5555555555555555;
              lVar22 = 0;
              uVar21 = 0;
              puVar15 = tree_num;
              pdVar16 = per_tree_depths;
              do {
                puVar5 = puVar15;
                if (tree_num == (unsigned_long *)0x0) {
                  puVar5 = tree_num;
                }
                pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
                if (per_tree_depths == (double *)0x0) {
                  pdVar4 = (double *)0x0;
                }
                traverse_hplane_fast_rowmajor<float,unsigned_long>
                          ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                           ((long)&(pvVar19->
                                   super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar22),
                           model_outputs_ext,
                           local_90.numeric_data + local_90.ncols_numeric * (long)local_d8,&local_f0
                           ,puVar5,pdVar4,(size_t)local_d8);
                uVar21 = uVar21 + 1;
                pvVar19 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar10 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar3 = ((long)pvVar10 - (long)pvVar19 >> 3) * -0x5555555555555555;
                puVar15 = (unsigned_long *)((long)puVar15 + (long)local_e8);
                pdVar16 = pdVar16 + 1;
                lVar22 = lVar22 + 0x18;
                prediction_data_00 = local_e8;
              } while (uVar21 < uVar3);
            }
            output_depths[(long)local_d8] = local_f0;
            local_d8 = (double)((long)local_d8 + 1);
            lVar14 = lVar14 + 8;
            pvVar8 = pvVar10;
            pvVar10 = pvVar19;
          } while (local_d8 != (double)nrows);
        }
        else {
          local_e8 = (PredictionData<float,_unsigned_long> *)(nrows * 8);
          lVar14 = 0;
          prediction_data_00 = &local_90;
          local_d8 = 0.0;
          do {
            local_f0 = 0.0;
            pvVar19 = pvVar10;
            if ((long)pvVar8 - (long)pvVar10 != 0) {
              uVar3 = ((long)pvVar8 - (long)pvVar10 >> 3) * -0x5555555555555555;
              lVar22 = 0;
              uVar21 = 0;
              pdVar16 = per_tree_depths;
              puVar15 = tree_num;
              do {
                puVar5 = puVar15;
                if (tree_num == (unsigned_long *)0x0) {
                  puVar5 = tree_num;
                }
                pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
                if (per_tree_depths == (double *)0x0) {
                  pdVar4 = (double *)0x0;
                }
                traverse_hplane_fast_colmajor<PredictionData<float,unsigned_long>,unsigned_long>
                          ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                           ((long)&(pvVar19->
                                   super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar22),
                           model_outputs_ext,prediction_data_00,&local_f0,puVar5,pdVar4,
                           (size_t)local_d8);
                uVar21 = uVar21 + 1;
                pvVar19 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar10 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar3 = ((long)pvVar10 - (long)pvVar19 >> 3) * -0x5555555555555555;
                puVar15 = (unsigned_long *)((long)puVar15 + (long)local_e8);
                pdVar16 = pdVar16 + 1;
                lVar22 = lVar22 + 0x18;
              } while (uVar21 < uVar3);
            }
            output_depths[(long)local_d8] = local_f0;
            local_d8 = (double)((long)local_d8 + 1);
            lVar14 = lVar14 + 8;
            pvVar8 = pvVar10;
            pvVar10 = pvVar19;
          } while (local_d8 != (double)nrows);
        }
      }
      else {
        local_e8 = (PredictionData<float,_unsigned_long> *)(nrows * 8);
        lVar14 = 0;
        local_d8 = 0.0;
        pvVar10 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar8 = (model_outputs_ext->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_f0 = 0.0;
          pvVar19 = pvVar8;
          if ((long)pvVar10 - (long)pvVar8 != 0) {
            uVar3 = ((long)pvVar10 - (long)pvVar8 >> 3) * -0x5555555555555555;
            lVar22 = 0;
            uVar21 = 0;
            pdVar16 = per_tree_depths;
            puVar15 = tree_num;
            do {
              puVar5 = puVar15;
              if (tree_num == (unsigned_long *)0x0) {
                puVar5 = tree_num;
              }
              pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
              if (per_tree_depths == (double *)0x0) {
                pdVar4 = (double *)0x0;
              }
              traverse_hplane<PredictionData<float,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar19->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar22),
                         model_outputs_ext,&local_90,&local_f0,
                         (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                         (ImputedData<unsigned_long,_double> *)0x0,puVar5,pdVar4,(size_t)local_d8);
              uVar21 = uVar21 + 1;
              pvVar19 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar8 = (model_outputs_ext->hplanes).
                       super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              uVar3 = ((long)pvVar8 - (long)pvVar19 >> 3) * -0x5555555555555555;
              puVar15 = (unsigned_long *)((long)puVar15 + (long)local_e8);
              pdVar16 = pdVar16 + 1;
              lVar22 = lVar22 + 0x18;
            } while (uVar21 < uVar3);
          }
          output_depths[(long)local_d8] = local_f0;
          local_d8 = (double)((long)local_d8 + 1);
          lVar14 = lVar14 + 8;
          pvVar10 = pvVar8;
          prediction_data_00 = (PredictionData<float,_unsigned_long> *)per_tree_depths;
          pvVar8 = pvVar19;
        } while (local_d8 != (double)nrows);
      }
      goto LAB_00147f71;
    }
    if (model_outputs->missing_action != Fail) {
LAB_00147c15:
      local_c0 = 0;
      local_a8 = nrows * 8;
      local_e8 = (PredictionData<float,_unsigned_long> *)0x0;
      uVar3 = 0;
      sVar6 = 0;
      do {
        if ((uVar3 & 1) == 0) {
          pvVar20 = (model_outputs->trees).
                    super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar14 = (long)(model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar20;
          local_e0 = uVar3;
          if (lVar14 == 0) {
            dVar26 = 0.0;
          }
          else {
            uVar3 = (lVar14 >> 3) * -0x5555555555555555;
            dVar26 = 0.0;
            lVar14 = 0;
            uVar21 = 0;
            puVar15 = tree_num;
            pdVar16 = per_tree_depths;
            do {
              puVar5 = puVar15;
              if (tree_num == (unsigned_long *)0x0) {
                puVar5 = tree_num;
              }
              pdVar4 = (double *)(uVar3 * (long)local_e8 + (long)pdVar16);
              if (per_tree_depths == (double *)0x0) {
                pdVar4 = (double *)0x0;
              }
              local_d8 = dVar26;
              dVar26 = traverse_itree<PredictionData<float,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                                 ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                  ((long)&(pvVar20->
                                          super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                          _M_impl + lVar14),model_outputs,&local_90,
                                  (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                  (ImputedData<unsigned_long,_double> *)0x0,0.0,sVar6,puVar5,pdVar4,
                                  0);
              dVar26 = local_d8 + dVar26;
              uVar21 = uVar21 + 1;
              pvVar20 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar3 = ((long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar20 >> 3) *
                      -0x5555555555555555;
              puVar15 = (unsigned_long *)((long)puVar15 + local_a8);
              pdVar16 = pdVar16 + 1;
              lVar14 = lVar14 + 0x18;
              prediction_data_00 = extraout_RDX_00;
            } while (uVar21 < uVar3);
          }
          output_depths[sVar6] = dVar26;
          uVar3 = local_e0;
        }
        sVar6 = sVar6 + 1;
        local_e8 = (PredictionData<float,_unsigned_long> *)((long)local_e8 + 8);
      } while (sVar6 != nrows);
      if ((uVar3 & 1) != 0) {
        local_b8[0] = local_c0;
        if (local_c0 != 0) {
          std::__exception_ptr::exception_ptr::_M_addref();
        }
        uVar12 = std::rethrow_exception((exception_ptr)local_b8);
        if (local_c0 != 0) {
          std::__exception_ptr::exception_ptr::_M_release();
        }
        _Unwind_Resume(uVar12);
      }
      if (local_c0 != 0) {
        std::__exception_ptr::exception_ptr::_M_release();
        prediction_data_00 = extraout_RDX_01;
      }
      goto LAB_00147f71;
    }
    if (model_outputs->new_cat_action == Weighted) {
      if (((Xc_indptr == (unsigned_long *)0x0) && (Xr_indptr == (unsigned_long *)0x0)) &&
         (categ_data == (int *)0x0 || model_outputs->cat_split_type == SingleCateg))
      goto LAB_00148531;
      goto LAB_00147c15;
    }
    if (Xc_indptr != (unsigned_long *)0x0 || Xr_indptr != (unsigned_long *)0x0) goto LAB_00147c15;
LAB_00148531:
    if (model_outputs->has_range_penalty != false) goto LAB_00147c15;
    pvVar20 = (model_outputs->trees).
              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (model_outputs->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
      lVar14 = 0;
      local_d8 = 0.0;
      do {
        pvVar11 = pvVar20;
        local_f0 = 0.0;
        pvVar20 = pvVar11;
        if ((long)pvVar9 - (long)pvVar11 != 0) {
          uVar3 = ((long)pvVar9 - (long)pvVar11 >> 3) * -0x5555555555555555;
          lVar22 = 0;
          uVar21 = 0;
          puVar15 = tree_num;
          pdVar16 = per_tree_depths;
          do {
            puVar5 = puVar15;
            if (tree_num == (unsigned_long *)0x0) {
              puVar5 = tree_num;
            }
            pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
            if (per_tree_depths == (double *)0x0) {
              pdVar4 = (double *)0x0;
            }
            traverse_itree_fast<float,unsigned_long>
                      ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                       ((long)&(pvVar20->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar22),model_outputs,
                       local_90.numeric_data + local_90.ncols_numeric * (long)local_d8,&local_f0,
                       puVar5,pdVar4,(size_t)local_d8);
            uVar21 = uVar21 + 1;
            pvVar20 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar11 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar3 = ((long)pvVar11 - (long)pvVar20 >> 3) * -0x5555555555555555;
            puVar15 = puVar15 + nrows;
            pdVar16 = pdVar16 + 1;
            lVar22 = lVar22 + 0x18;
          } while (uVar21 < uVar3);
        }
        output_depths[(long)local_d8] = local_f0;
        local_d8 = (double)((long)local_d8 + 1);
        lVar14 = lVar14 + 8;
        pvVar9 = pvVar11;
      } while (local_d8 != (double)nrows);
    }
    else {
      lVar14 = 0;
      local_d8 = 0.0;
      do {
        pvVar11 = pvVar20;
        local_f0 = 0.0;
        pvVar20 = pvVar11;
        if ((long)pvVar9 - (long)pvVar11 != 0) {
          uVar3 = ((long)pvVar9 - (long)pvVar11 >> 3) * -0x5555555555555555;
          lVar22 = 0;
          uVar21 = 0;
          pdVar16 = per_tree_depths;
          puVar15 = tree_num;
          do {
            puVar5 = puVar15;
            if (tree_num == (unsigned_long *)0x0) {
              puVar5 = tree_num;
            }
            pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
            if (per_tree_depths == (double *)0x0) {
              pdVar4 = (double *)0x0;
            }
            traverse_itree_no_recurse<PredictionData<float,unsigned_long>,unsigned_long>
                      ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                       ((long)&(pvVar20->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar22),model_outputs,
                       &local_90,&local_f0,puVar5,pdVar4,(size_t)local_d8);
            uVar21 = uVar21 + 1;
            pvVar20 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar11 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar3 = ((long)pvVar11 - (long)pvVar20 >> 3) * -0x5555555555555555;
            puVar15 = puVar15 + nrows;
            pdVar16 = pdVar16 + 1;
            lVar22 = lVar22 + 0x18;
          } while (uVar21 < uVar3);
        }
        output_depths[(long)local_d8] = local_f0;
        local_d8 = (double)((long)local_d8 + 1);
        lVar14 = lVar14 + 8;
        pvVar9 = pvVar11;
      } while (local_d8 != (double)nrows);
    }
LAB_00147f7d:
    lVar14 = ((long)pvVar11 - (long)pvVar20 >> 3) * -0x5555555555555555;
    auVar27._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar27._0_8_ = lVar14;
    auVar27._12_4_ = 0x45300000;
    dStack_d0 = auVar27._8_8_ - 1.9342813113834067e+25;
    local_d8 = dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
    pPVar29 = (PredictionData<float,_unsigned_long> *)(model_outputs->exp_avg_depth * local_d8);
    SVar13 = model_outputs->scoring_metric;
    bVar23 = SVar13 == Density;
    uVar18 = (undefined7)((ulong)model_outputs >> 8);
    if (bVar23) {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar24 = model_outputs_ext->scoring_metric == BoxedRatio;
        bVar23 = true;
LAB_00148078:
        uVar17 = (uint)CONCAT71(uVar18,model_outputs_ext->scoring_metric == BoxedDensity);
LAB_00148082:
        SVar13 = model_outputs_ext->scoring_metric;
        local_e0 = (ulong)local_e0._4_4_ << 0x20;
        goto LAB_0014808f;
      }
      bVar24 = false;
LAB_001480b9:
      bVar25 = SVar13 == BoxedDensity2;
      uVar17 = 0;
LAB_001480c2:
      local_e0 = (ulong)local_e0._4_4_ << 0x20;
    }
    else {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar23 = model_outputs_ext->scoring_metric == Density;
        bVar24 = true;
        if (SVar13 == BoxedRatio) goto LAB_00148078;
        bVar24 = model_outputs_ext->scoring_metric == BoxedRatio;
        uVar17 = (uint)CONCAT71(uVar18,1);
        if ((SVar13 == BoxedDensity) ||
           (uVar17 = (uint)CONCAT71(uVar18,model_outputs_ext->scoring_metric == BoxedDensity),
           SVar13 != BoxedDensity2)) goto LAB_00148082;
        bVar25 = true;
        goto LAB_001480c2;
      }
      bVar24 = SVar13 == BoxedRatio;
      if (SVar13 != BoxedDensity) goto LAB_001480b9;
      uVar17 = (uint)CONCAT71(uVar18,1);
      bVar23 = false;
      local_e0 = (ulong)local_e0._4_4_ << 0x20;
      bVar25 = false;
    }
  }
  local_a8 = CONCAT44(local_a8._4_4_,uVar17);
  if (standardize) {
    if (bVar23 || bVar25) {
      sVar6 = 0;
      do {
        output_depths[sVar6] = output_depths[sVar6] / -local_d8;
        sVar6 = sVar6 + 1;
      } while (nrows != sVar6);
    }
    else if ((char)uVar17 == '\0') {
      if (bVar24) {
        sVar6 = 0;
        do {
          output_depths[sVar6] = output_depths[sVar6] / local_d8;
          sVar6 = sVar6 + 1;
        } while (nrows != sVar6);
      }
      else {
        sVar6 = 0;
        local_e8 = pPVar29;
        do {
          dVar26 = exp2(-output_depths[sVar6] / (double)local_e8);
          output_depths[sVar6] = dVar26;
          sVar6 = sVar6 + 1;
        } while (nrows != sVar6);
      }
    }
    else {
      sVar6 = 0;
      do {
        dVar26 = exp(output_depths[sVar6] / local_d8);
        output_depths[sVar6] = -dVar26;
        sVar6 = sVar6 + 1;
      } while (nrows != sVar6);
    }
  }
  else if ((bVar23 || (char)uVar17 != '\0') || bVar25) {
    sVar6 = 0;
    do {
      dVar26 = exp(output_depths[sVar6] / local_d8);
      output_depths[sVar6] = dVar26;
      sVar6 = sVar6 + 1;
    } while (nrows != sVar6);
  }
  else if (bVar24) {
    sVar6 = 0;
    do {
      output_depths[sVar6] = output_depths[sVar6] / -local_d8;
      sVar6 = sVar6 + 1;
    } while (nrows != sVar6);
  }
  else {
    sVar6 = 0;
    do {
      output_depths[sVar6] = output_depths[sVar6] / local_d8;
      sVar6 = sVar6 + 1;
    } while (nrows != sVar6);
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar23 || (local_a8 & 1) != 0) || bVar25)) {
    pEVar7 = (ExtIsoForest *)model_outputs;
    if ((char)local_e0 != '\0') {
      pEVar7 = model_outputs_ext;
    }
    lVar14 = nrows * -0x5555555555555555 *
             ((long)(pEVar7->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar7->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    if (lVar14 != 0) {
      lVar22 = 0;
      do {
        dVar26 = exp(per_tree_depths[lVar22]);
        per_tree_depths[lVar22] = dVar26;
        lVar22 = lVar22 + 1;
      } while (lVar14 - lVar22 != 0);
    }
  }
  if (tree_num == (unsigned_long *)0x0) {
    return;
  }
  if ((indexer == (TreesIndexer *)0x0) ||
     (pSVar1 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start,
     pSVar1 == (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
LAB_00148319:
    remap_terminal_trees<PredictionData<float,unsigned_long>,unsigned_long>
              (model_outputs,model_outputs_ext,&local_90,tree_num,local_9c);
  }
  else {
    if ((char)local_e0 == '\0') {
      if ((model_outputs->missing_action == Divide) ||
         (((lVar14 = (long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
           model_outputs->new_cat_action == Weighted && (local_98 != (int *)0x0)) &&
          (model_outputs->cat_split_type == SubSet)))) goto LAB_00148319;
    }
    else {
      lVar14 = (long)(model_outputs_ext->hplanes).
                     super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model_outputs_ext->hplanes).
                     super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
    if (lVar14 != 0) {
      lVar22 = (lVar14 >> 3) * -0x5555555555555555;
      lVar14 = 0;
      do {
        puVar2 = pSVar1[lVar14].terminal_node_mappings.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar6 = 0;
        do {
          tree_num[sVar6] = puVar2[tree_num[sVar6]];
          sVar6 = sVar6 + 1;
        } while (nrows != sVar6);
        lVar14 = lVar14 + 1;
        tree_num = tree_num + nrows;
      } while (lVar14 != lVar22 + (ulong)(lVar22 == 0));
    }
  }
  return;
}

Assistant:

void predict_iforest(real_t *restrict numeric_data, int *restrict categ_data,
                     bool is_col_major, size_t ld_numeric, size_t ld_categ,
                     real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double *restrict output_depths,   sparse_ix *restrict tree_num,
                     double *restrict per_tree_depths,
                     TreesIndexer *indexer)
{
    if (unlikely(!nrows)) return;

    /* put data in a struct for passing it in fewer lines */
    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      is_col_major, ld_numeric, ld_categ,
                                      Xc, Xc_ind, Xc_indptr,
                                      Xr, Xr_ind, Xr_indptr};

    int nthreads_orig = nthreads;
    if ((size_t)nthreads > nrows)
        nthreads = nrows;

    /* For batch predictions of sparse CSC, will take a specialized route */
    if (prediction_data.Xc_indptr != NULL && (prediction_data.categ_data == NULL || prediction_data.is_col_major))
    {
        batched_csc_predict(prediction_data, nthreads_orig,
                            model_outputs, model_outputs_ext,
                            output_depths, tree_num,
                            per_tree_depths);
    }

    /* Regular case (no specialized CSC route) */
    else if (model_outputs != NULL)
    {
        if (
            model_outputs->missing_action == Fail &&
            (model_outputs->new_cat_action != Weighted || model_outputs->cat_split_type == SingleCateg || prediction_data.categ_data == NULL) &&
            prediction_data.Xc_indptr == NULL && prediction_data.Xr_indptr == NULL &&
            !model_outputs->has_range_penalty
            )
        {
            if (prediction_data.categ_data == NULL && (nrows == 1 || !prediction_data.is_col_major))
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_fast(model_outputs->trees[tree],
                                            *model_outputs,
                                            prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                            score,
                                            (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                            (per_tree_depths == NULL)?
                                                NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                            (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_no_recurse(model_outputs->trees[tree],
                                                  *model_outputs,
                                                  prediction_data,
                                                  score,
                                                  (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                  (per_tree_depths == NULL)?
                                                      NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                  (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            bool threw_exception = false;
            std::exception_ptr ex = NULL;

            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths, threw_exception, ex)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                if (threw_exception) continue;
                double score = 0;
                try
                {
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        score += traverse_itree(model_outputs->trees[tree],
                                                *model_outputs,
                                                prediction_data,
                                                (std::vector<ImputeNode>*)NULL,
                                                (ImputedData<sparse_ix, double>*)NULL,
                                                (double)0,
                                                (size_t) row,
                                                (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                (per_tree_depths == NULL)?
                                                    NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                (size_t) 0);
                    }
                    output_depths[row] = score;
                }
                catch (...)
                {
                    #pragma omp critical
                    {
                        if (!threw_exception)
                        {
                            threw_exception = true;
                            ex = std::current_exception();
                        }
                    }
                }
            }

            if (threw_exception)
                std::rethrow_exception(ex);
        }
    }
    

    else
    {
        if (
            model_outputs_ext->missing_action == Fail &&
            prediction_data.categ_data == NULL &&
            prediction_data.Xc_indptr == NULL &&
            prediction_data.Xr_indptr == NULL &&
            !model_outputs_ext->has_range_penalty
            )
        {
            if (prediction_data.is_col_major && nrows > 1)
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_colmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_rowmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                double score = 0;
                for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                {
                    traverse_hplane(model_outputs_ext->hplanes[tree],
                                    *model_outputs_ext,
                                    prediction_data,
                                    score,
                                    (std::vector<ImputeNode>*)NULL,
                                    (ImputedData<sparse_ix, double>*)NULL,
                                    (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                    (per_tree_depths == NULL)?
                                        NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                    (size_t) row);
                }
                output_depths[row] = score;
            }
        }
    }

    /* translate sum-of-depths to outlier score */
    double ntrees, depth_divisor;
    if (model_outputs != NULL)
    {
        ntrees = (double) model_outputs->trees.size();
        depth_divisor = ntrees * (model_outputs->exp_avg_depth);
    }

    else
    {
        ntrees = (double) model_outputs_ext->hplanes.size();
        depth_divisor = ntrees * (model_outputs_ext->exp_avg_depth);
    }

    
    /* for density and boxed_ratio, each tree will have 'log(d)'' instead of 'd' */
    bool is_density = (model_outputs != NULL && model_outputs->scoring_metric == Density) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == Density);
    bool is_bratio  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedRatio) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedRatio);
    bool is_bdens   = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity);
    bool is_bdens2  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity2) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity2);

    if (standardize)
    {
        if (is_density || is_bdens2)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else if (is_bdens)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = -std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = output_depths[row] / ntrees;
        }

        else
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp2( - output_depths[row] / depth_divisor );
        }
    }

    else
    {
        if (is_density || is_bdens || is_bdens2)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }
    }

    if (per_tree_depths != NULL && (is_density || is_bdens || is_bdens2))
    {
        size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < nrows*ntrees; ix++)
            per_tree_depths[ix] = std::exp(per_tree_depths[ix]);
    }


    /* re-map tree numbers to start at zero (if predicting tree numbers) */
    /* Note: usually this type of 'prediction' is not required,
       thus this mapping is not stored in the model objects so as to
       save memory */
    if (tree_num != NULL)
    {
        if (indexer != NULL && !indexer->indices.empty())
        {
            size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
            if (model_outputs != NULL)
            {
                if (model_outputs->missing_action == Divide)
                    goto manual_remap;
                if (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && categ_data != NULL)
                    goto manual_remap;
            }

            for (size_t tree = 0; tree < ntrees; tree++)
            {
                size_t *restrict mapping = indexer->indices[tree].terminal_node_mappings.data();
                for (size_t row = 0; row < nrows; row++)
                {
                    tree_num[row + tree*nrows] = mapping[tree_num[row + tree*nrows]];
                }
            }
        }

        else
        {
            manual_remap:
            remap_terminal_trees(model_outputs, model_outputs_ext,
                                 prediction_data, tree_num, nthreads);
        }
    }
}